

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::checkInput(Amr *this)

{
  bool bVar1;
  int iVar2;
  IntVect *pIVar3;
  Geometry *pGVar4;
  Box *this_00;
  Print *this_01;
  long in_RDI;
  int idim_2;
  int i_4;
  int idim_1;
  int i_3;
  int len;
  int i_2;
  Box *domain;
  int i_1;
  int k;
  int idim;
  int i;
  size_type in_stack_fffffffffffffd78;
  char (*x) [35];
  Print *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  uint uVar5;
  ostream *in_stack_fffffffffffffda8;
  Print *in_stack_fffffffffffffdb0;
  Print *in_stack_fffffffffffffdf0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b4;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  
  if (*(int *)(in_RDI + 0xc) < 0) {
    Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  for (local_9c = 0; local_9c <= *(int *)(in_RDI + 0xc); local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < 3; local_a0 = local_a0 + 1) {
      pIVar3 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_a4 = pIVar3->vect[local_a0];
      uVar5 = in_stack_fffffffffffffd94;
      while( true ) {
        in_stack_fffffffffffffd94 = uVar5 & 0xffffff;
        if (0 < local_a4) {
          in_stack_fffffffffffffd94 = CONCAT13(local_a4 % 2 == 0,(int3)uVar5);
        }
        if ((char)(in_stack_fffffffffffffd94 >> 0x18) == '\0') break;
        local_a4 = local_a4 / 2;
        uVar5 = in_stack_fffffffffffffd94;
      }
      if (local_a4 != 1) {
        Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      }
    }
  }
  for (local_a8 = 0; local_a8 < *(int *)(in_RDI + 0xc); local_a8 = local_a8 + 1) {
    iVar2 = AmrMesh::MaxRefRatio
                      ((AmrMesh *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd8c);
    if (iVar2 < 2) {
      Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
  }
  pGVar4 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffffd80,
                         (int)(in_stack_fffffffffffffd78 >> 0x20));
  this_00 = Geometry::Domain(pGVar4);
  bVar1 = Box::ok(this_00);
  if (!bVar1) {
    Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
    in_stack_fffffffffffffd90 = Box::length(this_00,local_b4);
    pIVar3 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                       ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                        in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    if (in_stack_fffffffffffffd90 % pIVar3->vect[local_b4] != 0) {
      Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
  }
  for (local_bc = 0; local_bc <= *(int *)(in_RDI + 0xc); local_bc = local_bc + 1) {
    for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
      pIVar3 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if (pIVar3->vect[local_c0] % 2 != 0) {
        Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      }
    }
  }
  for (local_c4 = 0; local_c4 <= *(int *)(in_RDI + 0xc); local_c4 = local_c4 + 1) {
    for (local_c8 = 0; local_c8 < 3; local_c8 = local_c8 + 1) {
      pIVar3 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      iVar2 = pIVar3->vect[local_c8];
      pIVar3 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if (iVar2 % pIVar3->vect[local_c8] != 0) {
        Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      }
    }
  }
  pGVar4 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffffd80,
                         (int)(in_stack_fffffffffffffd78 >> 0x20));
  Geometry::ProbDomain(pGVar4);
  bVar1 = RealBox::ok((RealBox *)in_stack_fffffffffffffd80);
  if (!bVar1) {
    Error_host((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  if (0 < *(int *)(in_RDI + 8)) {
    OutStream();
    x = (char (*) [35])&stack0xfffffffffffffdb0;
    Print::Print(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    this_01 = Print::operator<<(in_stack_fffffffffffffd80,x);
    Print::operator<<(this_01,*x);
    Print::~Print(in_stack_fffffffffffffdf0);
  }
  return;
}

Assistant:

void
Amr::checkInput ()
{
    if (max_level < 0) {
        amrex::Error("checkInput: max_level not set");
    }
    //
    // Check that blocking_factor is a power of 2.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            int k = blocking_factor[i][idim];
            while ( k > 0 && (k%2 == 0) ) {
                k /= 2;
            }
            if (k != 1) {
                amrex::Error("Amr::checkInput: blocking_factor not power of 2");
            }
        }
    }
    //
    // Check level dependent values.
    //
    for (int i = 0; i < max_level; i++)
    {
        if (MaxRefRatio(i) < 2) {
            amrex::Error("Amr::checkInput: bad ref_ratios");
        }
    }
    const Box& domain = Geom(0).Domain();
    if (!domain.ok()) {
        amrex::Error("level 0 domain bad or not set");
    }
    //
    // Check that domain size is a multiple of blocking_factor[0].
    //
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        int len = domain.length(i);
        if (len%blocking_factor[0][i] != 0) {
            amrex::Error("domain size not divisible by blocking_factor");
        }
    }
    //
    // Check that max_grid_size is even.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (max_grid_size[i][idim]%2 != 0) {
                amrex::Error("max_grid_size is not even");
            }
        }
    }

    //
    // Check that max_grid_size is a multiple of blocking_factor at every level.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (max_grid_size[i][idim]%blocking_factor[i][idim] != 0) {
                amrex::Error("max_grid_size not divisible by blocking_factor");
            }
        }
    }

    if( ! Geom(0).ProbDomain().ok()) {
        amrex::Error("Amr::checkInput: bad physical problem size");
    }

    if(verbose > 0) {
        amrex::Print() << "Successfully read inputs file ... " << '\n';
    }
}